

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::logger::addIssue<int,int>
          (logger *this,severity severity,issue *issue,int args,int args_1)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  void *this_00;
  undefined8 uVar5;
  fatal *this_01;
  int in_ESI;
  uint *in_RDI;
  uint32_t j_2;
  uint32_t j_1;
  uint32_t ll;
  uint32_t lei;
  uint32_t lsi;
  uint32_t line;
  size_t nchars;
  string message;
  stringstream oss;
  uint32_t j;
  uint32_t indent;
  uint32_t baseIndent;
  max_issues_exceeded *in_stack_fffffffffffffda0;
  uint local_238;
  uint local_208;
  uint local_204;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  long local_1f0;
  string local_1e8 [48];
  stringstream local_1b8 [120];
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  stringstream *in_stack_fffffffffffffed0;
  uint local_2c;
  uint local_28;
  
  if ((in_RDI[1] & 1) == 0) {
    if ((in_RDI[4] & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Issues in: ");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 6));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      *(undefined1 *)(in_RDI + 4) = 1;
    }
    local_28 = 0;
    if (*in_RDI <= in_RDI[2] + in_RDI[3]) {
      uVar5 = __cxa_allocate_exception(0x10);
      max_issues_exceeded::max_issues_exceeded(in_stack_fffffffffffffda0);
      __cxa_throw(uVar5,&max_issues_exceeded::typeinfo,max_issues_exceeded::~max_issues_exceeded);
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      std::ostream::put(-0x30);
    }
    if (in_ESI == 0) {
      std::operator<<((ostream *)&std::cout,"WARNING: ");
      local_28 = 0xd;
      in_RDI[3] = in_RDI[3] + 1;
    }
    else if (in_ESI == 1) {
      std::operator<<((ostream *)&std::cout,"ERROR: ");
      local_28 = 0xb;
      in_RDI[2] = in_RDI[2] + 1;
    }
    else if (in_ESI == 2) {
      std::operator<<((ostream *)&std::cout,"FATAL: ");
      local_28 = 0xb;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    sprintf<int,int>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0);
    std::__cxx11::stringstream::str();
    local_1f0 = std::__cxx11::string::size();
    local_1f4 = 0;
    local_1f8 = 0;
    for (; 0x50 < local_1f0 + (ulong)local_28; local_1f0 = local_1f0 - (ulong)uVar1) {
      local_1fc = (local_1f8 + 0x4f) - local_28;
      while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8), *pcVar3 != ' ') {
        local_1fc = local_1fc + -1;
      }
      uVar1 = local_1fc - local_1f8;
      local_204 = 0;
      while( true ) {
        if (local_1f4 == 0) {
          local_238 = 0;
        }
        else {
          local_238 = local_28;
        }
        if (local_238 <= local_204) break;
        std::ostream::put(-0x30);
        local_204 = local_204 + 1;
      }
      lVar4 = std::__cxx11::string::operator[]((ulong)local_1e8);
      this_00 = (void *)std::ostream::write((char *)&std::cout,lVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_1f8 = local_1fc + 1;
      local_1f4 = local_1f4 + 1;
    }
    local_208 = 0;
    while( true ) {
      uVar1 = 0;
      if (local_1f4 != 0) {
        uVar1 = 4;
      }
      if (uVar1 <= local_208) break;
      std::ostream::put(-0x30);
      local_208 = local_208 + 1;
    }
    lVar4 = std::__cxx11::string::operator[]((ulong)local_1e8);
    std::ostream::write((char *)&std::cout,lVar4);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else if (in_ESI == 0) {
    in_RDI[3] = in_RDI[3] + 1;
  }
  else if (in_ESI == 1) {
    in_RDI[2] = in_RDI[2] + 1;
  }
  if (in_ESI == 2) {
    this_01 = (fatal *)__cxa_allocate_exception(0x10);
    fatal::fatal(this_01);
    __cxa_throw(this_01,&fatal::typeinfo,fatal::~fatal);
  }
  return;
}

Assistant:

void
ktxValidator::logger::addIssue(severity severity, issue issue, Args ... args)
{
    if (quiet) {
        switch (severity) {
          case eError:
            errorCount++;
            break;
          case eFatal:
            break;
          case eWarning:
            warningCount++;
            break;
        }
    } else {
        if (!headerWritten) {
            cout << "Issues in: " << nameOfFileBeingValidated << std::endl;
            headerWritten = true;
        }
        const uint32_t baseIndent = 4;
        uint32_t indent = 0;
        if ((errorCount + warningCount ) < maxIssues) {
            for (uint32_t j = 0; j < baseIndent; j++)
              cout.put(' ');
            switch (severity) {
              case eError:
                cout << "ERROR: ";
                indent = baseIndent + 7;
                errorCount++;
                break;
              case eFatal:
                cout << "FATAL: ";
                indent = baseIndent + 7;
                break;
              case eWarning:
                cout << "WARNING: ";
                indent = baseIndent + 9;
                warningCount++;
                break;
            }
            //fprintf(stdout, issue.message.c_str(), args...);
            std::stringstream oss;
            sprintf(oss, issue.message, args...);
            // Wrap lines on spaces.
            std::string message = oss.str();
            size_t nchars = message.size();
            uint32_t line = 0;
            uint32_t lsi = 0;  // line start index.
            uint32_t lei; // line end index
            while (nchars + indent > 80) {
                uint32_t ll; // line length
                lei = lsi + 79 - indent;
                while (message[lei] != ' ') lei--;
                ll = lei - lsi;
                for (uint32_t j = 0; j < (line ? indent : 0); j++) {
                    cout.put(' ');
                }
                cout.write(&message[lsi], ll) << std::endl;
                lsi = lei + 1; // +1 to skip the space
                nchars -= ll;
                line++;
            }
            for (uint32_t j = 0; j < (line ? baseIndent : 0); j++) {
                cout.put(' ');
            }
            cout.write(&message[lsi], nchars);
            cout << std::endl;
        } else {
            throw max_issues_exceeded();
        }
    }
    if (severity == eFatal)
        throw fatal();
}